

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

bool __thiscall TCBPoint::operator==(TCBPoint *this,TCBPoint *other)

{
  bool bVar1;
  QPointF *in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  QPointF *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
    local_11 = false;
    if (bVar1) {
      bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
      local_11 = false;
      if (bVar1) {
        local_11 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
      }
    }
  }
  return local_11;
}

Assistant:

bool operator==(const TCBPoint &other) const
    {
        return _point == other._point &&
                qFuzzyCompare(_t, other._t) &&
                qFuzzyCompare(_c, other._c) &&
                qFuzzyCompare(_b, other._b);
    }